

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

void __thiscall helics::CallbackFederate::loadOperator(CallbackFederate *this)

{
  int iVar1;
  element_type *peVar2;
  CallbackFederate **in_RDI;
  shared_ptr<helics::CallbackFederateOperator> *in_stack_ffffffffffffff38;
  shared_ptr<helics::CallbackFederateOperator> *in_stack_ffffffffffffff40;
  function<bool_()> *asyncCheck;
  Federate *this_00;
  function<bool_()> local_70;
  BaseType local_4c;
  BaseType local_48;
  undefined1 local_38 [20];
  uint local_24;
  
  this_00 = (Federate *)&stack0xffffffffffffffe8;
  std::make_shared<helics::CallbackFederateOperator,helics::CallbackFederate*>(in_RDI);
  std::shared_ptr<helics::CallbackFederateOperator>::operator=
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::shared_ptr<helics::CallbackFederateOperator>::~shared_ptr
            ((shared_ptr<helics::CallbackFederateOperator> *)0x3bd080);
  peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x3bd096);
  local_24 = (uint)Federate::getID((Federate *)((long)in_RDI + *(long *)&(*in_RDI)[-1].field_0x218))
  ;
  std::shared_ptr<helics::FederateOperator>::shared_ptr<helics::CallbackFederateOperator,void>
            ((shared_ptr<helics::FederateOperator> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  (*peVar2->_vptr_Core[0x56])(peVar2,(ulong)local_24,local_38);
  std::shared_ptr<helics::FederateOperator>::~shared_ptr
            ((shared_ptr<helics::FederateOperator> *)0x3bd0f9);
  peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x3bd10f);
  local_48 = (BaseType)
             Federate::getID((Federate *)((long)in_RDI + *(long *)&(*in_RDI)[-1].field_0x218));
  (*peVar2->_vptr_Core[0x22])(peVar2,(ulong)(uint)local_48,0x67,1);
  peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x3bd167);
  local_4c = (BaseType)
             Federate::getID((Federate *)((long)in_RDI + *(long *)&(*in_RDI)[-1].field_0x218));
  iVar1 = (*peVar2->_vptr_Core[0x23])(peVar2,(ulong)(uint)local_4c,0x51);
  *(char *)(in_RDI + 6) = (char)iVar1;
  asyncCheck = &local_70;
  std::function<bool()>::function<helics::CallbackFederate::loadOperator()::__0,void>
            ((function<bool_()> *)((long)in_RDI + *(long *)&(*in_RDI)[-1].field_0x218),
             (anon_class_8_1_8991fb9c *)peVar2);
  Federate::setAsyncCheck(this_00,asyncCheck);
  std::function<bool_()>::~function((function<bool_()> *)0x3bd1ee);
  return;
}

Assistant:

void CallbackFederate::loadOperator()
{
    op = std::make_shared<CallbackFederateOperator>(this);
    coreObject->setFederateOperator(getID(), op);
    coreObject->setFlagOption(getID(), HELICS_FLAG_CALLBACK_FEDERATE, true);
    mEventTriggered = coreObject->getFlagOption(getID(), HELICS_FLAG_EVENT_TRIGGERED);
    setAsyncCheck([this]() { return (getCurrentMode() >= Modes::FINALIZE); });
}